

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> * __thiscall
HighsSymmetryDetection::dumpCurrentGraph(HighsSymmetryDetection *this)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RSI;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_RDI;
  vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_> *this_00;
  HighsInt j_1;
  HighsInt j;
  HighsInt colCell;
  HighsInt i;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *graphTriplets;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int *in_stack_ffffffffffffffd8;
  int iVar5;
  value_type vVar6;
  int iVar7;
  uint3 in_stack_ffffffffffffffec;
  uint uVar8;
  
  uVar8 = (uint)in_stack_ffffffffffffffec;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::HighsHashTable
            ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  for (iVar7 = 0; iVar7 < *(int *)(in_RSI + 0x2a4); iVar7 = iVar7 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x98),(long)iVar7);
    vVar6 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar7);
    vVar1 = *pvVar3;
    while (iVar5 = vVar1,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x20),(long)iVar7),
          vVar1 != *pvVar3) {
      pvVar4 = std::
               vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                             *)(in_RSI + 0x38),(long)iVar5);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x98),(long)pvVar4->first);
      std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::
      operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                  *)(in_RSI + 0x38),(long)iVar5);
      HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)CONCAT44(uVar8,iVar7),
                 (int *)CONCAT44(vVar6,iVar5),in_stack_ffffffffffffffd8,
                 (uint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      vVar1 = iVar5 + 1;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x20),(long)iVar7);
    iVar2 = *pvVar3;
    while (in_stack_ffffffffffffffd0 = iVar2,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)(iVar7 + 1)),
          iVar2 != *pvVar3) {
      this_00 = (vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                 *)(in_RSI + 0x38);
      std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::
      operator[](this_00,(long)in_stack_ffffffffffffffd0);
      std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::
      operator[](this_00,(long)in_stack_ffffffffffffffd0);
      HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)CONCAT44(uVar8,iVar7),
                 (int *)CONCAT44(vVar6,iVar5),in_stack_ffffffffffffffd8,
                 (uint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      iVar2 = in_stack_ffffffffffffffd0 + 1;
    }
  }
  return in_RDI;
}

Assistant:

HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>
HighsSymmetryDetection::dumpCurrentGraph() {
  HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>> graphTriplets;

  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];
    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      graphTriplets.insert(vertexToCell[Gedge[j].first], colCell,
                           Gedge[j].second);
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      graphTriplets.insert(Gedge[j].first, colCell, Gedge[j].second);
  }

  return graphTriplets;
}